

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::sectionEnded
          (RunContext *this,SectionInfo *info,Counts *prevAssertions,double _durationInSeconds)

{
  ulong uVar1;
  IStreamingReporter *_durationInSeconds_00;
  long in_RDI;
  bool missingAssertions;
  Counts assertions;
  value_type *in_stack_fffffffffffffe58;
  Counts *in_stack_fffffffffffffe60;
  TestCaseTracker *this_00;
  undefined1 _missingAssertions;
  RunContext *in_stack_fffffffffffffe68;
  UnfinishedSections *in_stack_fffffffffffffe70;
  Counts *_assertions;
  SectionInfo *in_stack_fffffffffffffe78;
  SectionStats *in_stack_fffffffffffffe80;
  Counts local_170 [6];
  undefined1 local_d1;
  TestCaseTracker local_d0;
  
  uVar1 = std::uncaught_exception();
  if ((uVar1 & 1) == 0) {
    this_00 = &local_d0;
    Counts::operator-((Counts *)in_stack_fffffffffffffe70,(Counts *)in_stack_fffffffffffffe68);
    local_d1 = testForMissingAssertions(in_stack_fffffffffffffe68,(Counts *)this_00);
    Option<Catch::SectionTracking::TestCaseTracker>::operator->
              ((Option<Catch::SectionTracking::TestCaseTracker> *)(in_RDI + 0x40));
    SectionTracking::TestCaseTracker::leaveSection(this_00);
    _missingAssertions = (undefined1)((ulong)this_00 >> 0x38);
    _durationInSeconds_00 =
         Ptr<Catch::IStreamingReporter>::operator->
                   ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x1a8));
    _assertions = local_170;
    SectionStats::SectionStats
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,_assertions,
               (double)_durationInSeconds_00,(bool)_missingAssertions);
    (*(_durationInSeconds_00->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])
              (_durationInSeconds_00,_assertions);
    SectionStats::~SectionStats((SectionStats *)0x25b6fe);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x25b70f);
  }
  else {
    UnfinishedSections::UnfinishedSections
              (in_stack_fffffffffffffe70,(SectionInfo *)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
    std::
    vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ::push_back((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                 *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    UnfinishedSections::~UnfinishedSections((UnfinishedSections *)0x25b61c);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions, double _durationInSeconds ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions, _durationInSeconds ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            m_testCaseTracker->leaveSection();

            m_reporter->sectionEnded( SectionStats( info, assertions, _durationInSeconds, missingAssertions ) );
            m_messages.clear();
        }